

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

CaseFold * duckdb_re2::LookupCaseFold(CaseFold *f,int n,Rune r)

{
  int iVar1;
  ulong uVar2;
  CaseFold *pCVar3;
  CaseFold *pCVar4;
  uint uVar5;
  uint uVar6;
  
  pCVar4 = f;
  if (0 < n) {
    uVar5 = n;
    do {
      uVar6 = uVar5 >> 1;
      iVar1 = pCVar4[uVar6].lo;
      if ((iVar1 <= r) && (r <= pCVar4[uVar6].hi)) {
        return pCVar4 + uVar6;
      }
      uVar5 = uVar5 - (uVar6 + 1);
      if (r < iVar1) {
        uVar5 = uVar6;
      }
      uVar2 = (ulong)(uVar6 + 1);
      if (r < iVar1) {
        uVar2 = 0;
      }
      pCVar4 = pCVar4 + uVar2;
    } while (0 < (int)uVar5);
  }
  pCVar3 = (CaseFold *)0x0;
  if (pCVar4 < f + n) {
    pCVar3 = pCVar4;
  }
  return pCVar3;
}

Assistant:

const CaseFold* LookupCaseFold(const CaseFold *f, int n, Rune r) {
  const CaseFold* ef = f + n;

  // Binary search for entry containing r.
  while (n > 0) {
    int m = n/2;
    if (f[m].lo <= r && r <= f[m].hi)
      return &f[m];
    if (r < f[m].lo) {
      n = m;
    } else {
      f += m+1;
      n -= m+1;
    }
  }

  // There is no entry that contains r, but f points
  // where it would have been.  Unless f points at
  // the end of the array, it points at the next entry
  // after r.
  if (f < ef)
    return f;

  // No entry contains r; no entry contains runes > r.
  return NULL;
}